

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O3

Abc_Ntk_t * Io_ReadEqn(char *pFileName,int fCheck)

{
  undefined8 *puVar1;
  FILE *pFile;
  int iVar2;
  char *pCur;
  Extra_FileReader_t *p;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  Vec_Ptr_t *vTokens;
  void **ppvVar4;
  ProgressBar *p_00;
  void *pvVar5;
  byte *pbVar6;
  ulong uVar7;
  char *pStr;
  Abc_Obj_t *pAVar8;
  Hop_Obj_t *pHVar9;
  char *pNew;
  byte *pbVar10;
  char *pCur_1;
  byte *pbVar11;
  long lVar12;
  
  p = Extra_FileReaderAlloc(pFileName,"#",";","=");
  if (p != (Extra_FileReader_t *)0x0) {
    pNtk = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_AIG,1);
    pcVar3 = Extra_FileReaderGetFileName(p);
    pcVar3 = Extra_FileNameGeneric(pcVar3);
    pNtk->pName = pcVar3;
    pcVar3 = Extra_FileReaderGetFileName(p);
    pcVar3 = Extra_UtilStrsav(pcVar3);
    pNtk->pSpec = pcVar3;
    vTokens = (Vec_Ptr_t *)malloc(0x10);
    vTokens->nCap = 100;
    vTokens->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    vTokens->pArray = ppvVar4;
    pFile = _stdout;
    iVar2 = Extra_FileReaderGetFileSize(p);
    p_00 = Extra_ProgressBarStart(pFile,iVar2);
    pvVar5 = Extra_FileReaderGetTokens(p);
    while (pvVar5 != (void *)0x0) {
      iVar2 = Extra_FileReaderGetCurPosition(p);
      if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar2)) {
        Extra_ProgressBarUpdate_int(p_00,iVar2,(char *)0x0);
      }
      pbVar6 = (byte *)**(undefined8 **)((long)pvVar5 + 8);
      pbVar10 = pbVar6;
LAB_002d3834:
      uVar7 = (ulong)*pbVar6;
      if (0x20 < uVar7) {
LAB_002d384d:
        *pbVar10 = *pbVar6;
        pbVar10 = pbVar10 + 1;
LAB_002d3843:
        pbVar6 = pbVar6 + 1;
        goto LAB_002d3834;
      }
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_002d3843;
      if (uVar7 != 0) goto LAB_002d384d;
      *pbVar10 = 0;
      puVar1 = *(undefined8 **)((long)pvVar5 + 8);
      pcVar3 = (char *)*puVar1;
      if (*pcVar3 == '\0') break;
      if (*(int *)((long)pvVar5 + 4) != 2) {
        pcVar3 = Extra_FileReaderGetFileName(p);
        printf("%s: Wrong input file format.\n",pcVar3);
        Abc_NtkDelete(pNtk);
        Extra_FileReaderFree(p);
        return (Abc_Ntk_t *)0x0;
      }
      iVar2 = strncmp(pcVar3,"INORDER",7);
      if (iVar2 == 0) {
        Io_ReadEqnStrCutAt((char *)puVar1[1]," \n\r\t",0,vTokens);
        if (0 < vTokens->nSize) {
          lVar12 = 0;
          do {
            Io_ReadCreatePi(pNtk,(char *)vTokens->pArray[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 < vTokens->nSize);
        }
      }
      else {
        iVar2 = strncmp(pcVar3,"OUTORDER",8);
        pbVar6 = (byte *)puVar1[1];
        pbVar10 = pbVar6;
        pbVar11 = pbVar6;
        if (iVar2 == 0) {
          Io_ReadEqnStrCutAt((char *)pbVar6," \n\r\t",0,vTokens);
          if (0 < vTokens->nSize) {
            lVar12 = 0;
            do {
              Io_ReadCreatePo(pNtk,(char *)vTokens->pArray[lVar12]);
              lVar12 = lVar12 + 1;
            } while (lVar12 < vTokens->nSize);
          }
        }
        else {
LAB_002d38b1:
          uVar7 = (ulong)*pbVar11;
          if (0x20 < uVar7) {
LAB_002d38ca:
            *pbVar10 = *pbVar11;
            pbVar10 = pbVar10 + 1;
LAB_002d38c0:
            pbVar11 = pbVar11 + 1;
            goto LAB_002d38b1;
          }
          if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_002d38c0;
          if (uVar7 != 0) goto LAB_002d38ca;
          *pbVar10 = 0;
          if ((pbVar6[1] == 0) && ((*pbVar6 & 0xfe) == 0x30)) {
            vTokens->nSize = 0;
            iVar2 = 0;
            pStr = (char *)0x0;
          }
          else {
            pStr = Extra_UtilStrsav((char *)pbVar6);
            Io_ReadEqnStrCutAt(pStr,"!*+()",1,vTokens);
            iVar2 = vTokens->nSize;
          }
          pAVar8 = Io_ReadCreateNode(pNtk,pcVar3,(char **)vTokens->pArray,iVar2);
          pHVar9 = Parse_FormulaParserEqn
                             (_stdout,(char *)pbVar6,vTokens,(Hop_Man_t *)pNtk->pManFunc);
          (pAVar8->field_5).pData = pHVar9;
          if (pStr != (char *)0x0) {
            free(pStr);
          }
        }
      }
      pvVar5 = Extra_FileReaderGetTokens(p);
    }
    Extra_ProgressBarStop(p_00);
    if (vTokens->pArray != (void **)0x0) {
      free(vTokens->pArray);
    }
    free(vTokens);
    Abc_NtkFinalizeRead(pNtk);
    Extra_FileReaderFree(p);
    if (pNtk != (Abc_Ntk_t *)0x0) {
      if (fCheck == 0) {
        return pNtk;
      }
      iVar2 = Abc_NtkCheckRead(pNtk);
      if (iVar2 != 0) {
        return pNtk;
      }
      puts("Io_ReadEqn: The network check has failed.");
      Abc_NtkDelete(pNtk);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadEqn( char * pFileName, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", ";", "=" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadEqnNetwork( p );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadEqn: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}